

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O0

void jsoncons::encode_json<std::pair<int,std::__cxx11::string>,wchar_t>
               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *val,basic_json_visitor<wchar_t> *encoder)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  error_code ec;
  error_code *in_stack_ffffffffffffff80;
  ser_error *this;
  error_code *in_stack_ffffffffffffffb8;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_stack_ffffffffffffffc0;
  basic_json_visitor<wchar_t> *in_stack_ffffffffffffffc8;
  value_type *in_stack_ffffffffffffffd0;
  undefined1 local_20 [32];
  
  this = (ser_error *)local_20;
  std::error_code::error_code(in_stack_ffffffffffffff80);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
             in_stack_ffffffffffffff80);
  encode_traits<std::pair<int,std::__cxx11::string>,wchar_t,void>::
  encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)0xa17e8e);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_20);
  if (!bVar1) {
    basic_json_visitor<wchar_t>::flush((basic_json_visitor<wchar_t> *)0xa17f27);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = (error_category *)local_20._8_8_;
  ec_00._0_8_ = local_20._0_8_;
  ser_error::ser_error(this,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void encode_json(const T& val, basic_json_visitor<CharT>& encoder)
    {
        std::error_code ec;
        encode_traits<T,CharT>::encode(val, encoder, basic_json<CharT>(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        encoder.flush();
    }